

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O3

void NOPL3_WriteRegBuffered(opl3_chip *chip,uint16_t reg,uint8_t v)

{
  uint uVar1;
  opl3_writebuf *poVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = chip->writebuf_last;
  poVar2 = chip->writebuf + uVar1;
  uVar3._0_2_ = poVar2->reg;
  uVar3._2_1_ = poVar2->data;
  uVar3._3_1_ = poVar2->field_0xb;
  if ((uVar3 >> 9 & 1) == 0) {
    uVar4 = chip->writebuf_samplecnt;
    uVar3 = uVar1 + 1 & 0x3ff;
  }
  else {
    NOPL3_WriteReg(chip,(undefined2)uVar3 & 0x1ff,chip->writebuf[uVar1].data);
    uVar3 = uVar1 + 1 & 0x3ff;
    chip->writebuf_cur = uVar3;
    uVar4 = chip->writebuf[uVar1].time;
    chip->writebuf_samplecnt = uVar4;
  }
  chip->writebuf[uVar1].reg = reg | 0x200;
  chip->writebuf[uVar1].data = v;
  uVar5 = chip->writebuf_lasttime + 2;
  if (uVar5 <= uVar4) {
    uVar5 = uVar4;
  }
  chip->writebuf[uVar1].time = uVar5;
  chip->writebuf_lasttime = uVar5;
  chip->writebuf_last = uVar3;
  return;
}

Assistant:

void NOPL3_WriteRegBuffered(opl3_chip *chip, uint16_t reg, uint8_t v)
{
#ifdef NOPL_ENABLE_WRITEBUF
    uint64_t time1, time2;
    opl3_writebuf *writebuf;
    uint32_t writebuf_last;

    writebuf_last = chip->writebuf_last;
    writebuf = &chip->writebuf[writebuf_last];

    if (writebuf->reg & 0x200)
    {
        NOPL3_WriteReg(chip, writebuf->reg & 0x1ff, writebuf->data);

        chip->writebuf_cur = (writebuf_last + 1) % OPL_WRITEBUF_SIZE;
        chip->writebuf_samplecnt = writebuf->time;
    }

    writebuf->reg = reg | 0x200;
    writebuf->data = v;
    time1 = chip->writebuf_lasttime + OPL_WRITEBUF_DELAY;
    time2 = chip->writebuf_samplecnt;

    if (time1 < time2)
    {
        time1 = time2;
    }

    writebuf->time = time1;
    chip->writebuf_lasttime = time1;
    chip->writebuf_last = (writebuf_last + 1) % OPL_WRITEBUF_SIZE;
#else
    NOPL3_WriteReg(chip, reg, v);
#endif
}